

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void accumulate_next_frame_stats
               (FIRSTPASS_STATS *stats,int flash_detected,int frames_since_key,int cur_idx,
               GF_GROUP_STATS *gf_stats,int f_w,int f_h)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  FIRSTPASS_STATS *in_RDI;
  FIRSTPASS_STATS *in_R8;
  int in_R9D;
  double dVar1;
  double dVar2;
  int in_stack_00000008;
  double local_38;
  
  accumulate_frame_motion_stats
            (in_RDI,(GF_GROUP_STATS *)in_R8,(double)in_R9D,(double)in_stack_00000008);
  in_R8->inactive_zone_cols = in_RDI->sr_coded_error + in_R8->inactive_zone_cols;
  in_R8->MVr = in_RDI->pcnt_second_ref + in_R8->MVr;
  in_R8->mvr_abs = in_RDI->new_mv_count + in_R8->mvr_abs;
  in_R8->MVc = in_RDI->frame_avg_wavelet_energy + in_R8->MVc;
  if (1e-06 < ABS(in_RDI->raw_error_stdev)) {
    *(int *)&in_R8->MVrv = *(int *)&in_R8->MVrv + 1;
    in_R8->mvc_abs = in_RDI->raw_error_stdev + in_R8->mvc_abs;
  }
  if (in_ESI == 0) {
    in_R8->pcnt_second_ref = in_R8->pcnt_motion;
    dVar1 = get_prediction_decay_rate(in_R8);
    in_R8->pcnt_motion = dVar1;
    in_R8->sr_coded_error = in_R8->sr_coded_error * in_R8->pcnt_motion;
    if (1 < in_EDX + in_ECX + -1) {
      dVar1 = in_R8->pcnt_inter;
      dVar2 = get_zero_motion_factor(in_R8);
      if (dVar2 <= dVar1) {
        local_38 = get_zero_motion_factor(in_R8);
      }
      else {
        local_38 = in_R8->pcnt_inter;
      }
      in_R8->pcnt_inter = local_38;
    }
  }
  return;
}

Assistant:

static void accumulate_next_frame_stats(const FIRSTPASS_STATS *stats,
                                        const int flash_detected,
                                        const int frames_since_key,
                                        const int cur_idx,
                                        GF_GROUP_STATS *gf_stats, int f_w,
                                        int f_h) {
  accumulate_frame_motion_stats(stats, gf_stats, f_w, f_h);
  // sum up the metric values of current gf group
  gf_stats->avg_sr_coded_error += stats->sr_coded_error;
  gf_stats->avg_pcnt_second_ref += stats->pcnt_second_ref;
  gf_stats->avg_new_mv_count += stats->new_mv_count;
  gf_stats->avg_wavelet_energy += stats->frame_avg_wavelet_energy;
  if (fabs(stats->raw_error_stdev) > 0.000001) {
    gf_stats->non_zero_stdev_count++;
    gf_stats->avg_raw_err_stdev += stats->raw_error_stdev;
  }

  // Accumulate the effect of prediction quality decay
  if (!flash_detected) {
    gf_stats->last_loop_decay_rate = gf_stats->loop_decay_rate;
    gf_stats->loop_decay_rate = get_prediction_decay_rate(stats);

    gf_stats->decay_accumulator =
        gf_stats->decay_accumulator * gf_stats->loop_decay_rate;

    // Monitor for static sections.
    if ((frames_since_key + cur_idx - 1) > 1) {
      gf_stats->zero_motion_accumulator = AOMMIN(
          gf_stats->zero_motion_accumulator, get_zero_motion_factor(stats));
    }
  }
}